

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall Jupiter::IRC::Client::disconnect(Client *this,string_view message,bool stayDead)

{
  pointer this_00;
  size_type sVar1;
  const_pointer __n;
  int in_R8D;
  string local_58;
  __sv_type local_38;
  byte local_21;
  Client *pCStack_20;
  bool stayDead_local;
  Client *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (Client *)message._M_len;
  local_21 = stayDead;
  pCStack_20 = this;
  this_00 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                      (&this->m_socket);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __n = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  string_printf_abi_cxx11_(&local_58,"QUIT :%.*s\r\n",sVar1);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  Socket::send(this_00,(int)local_38._M_len,local_38._M_str,(size_t)__n,in_R8D);
  std::__cxx11::string::~string((string *)&local_58);
  disconnect(this,(bool)(local_21 & 1));
  return;
}

Assistant:

void Jupiter::IRC::Client::disconnect(std::string_view message, bool stayDead)
{
	m_socket->send(string_printf("QUIT :%.*s" ENDL, message.size(), message.data()));
	Jupiter::IRC::Client::disconnect(stayDead);
}